

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qcompleter.cpp
# Opt level: O1

void QCompleter::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  char cVar1;
  long *plVar2;
  undefined8 *puVar3;
  long lVar4;
  int *piVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  QArrayData *pQVar8;
  QString *prefix;
  undefined4 uVar9;
  int iVar10;
  QRect *rect;
  long in_FS_OFFSET;
  QRect local_48;
  undefined4 uStack_38;
  undefined4 local_34;
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c);
  switch(_id) {
  case 0:
    local_48.x2.m_i = (int)_a[1];
    local_48.y2.m_i = (int)((ulong)_a[1] >> 0x20);
    iVar10 = 0;
    goto LAB_0065bf0a;
  case 1:
    local_48.x2.m_i = (int)_a[1];
    local_48.y2.m_i = (int)((ulong)_a[1] >> 0x20);
    iVar10 = 1;
    goto LAB_0065bf0a;
  case 2:
    local_48.x2.m_i = (int)_a[1];
    local_48.y2.m_i = (int)((ulong)_a[1] >> 0x20);
    iVar10 = 2;
    goto LAB_0065bf0a;
  case 3:
    local_48.x2.m_i = (int)_a[1];
    local_48.y2.m_i = (int)((ulong)_a[1] >> 0x20);
    iVar10 = 3;
LAB_0065bf0a:
    local_48.y1.m_i = 0;
    local_48.x1.m_i = 0;
    QMetaObject::activate(_o,&staticMetaObject,iVar10,(void **)&local_48);
    break;
  case 4:
    setCompletionPrefix((QCompleter *)_o,(QString *)_a[1]);
    break;
  case 5:
    rect = (QRect *)_a[1];
    goto LAB_0065bf26;
  case 6:
    rect = &local_48;
    local_48.x1.m_i = 0;
    local_48.y1.m_i = 0;
    local_48.x2.m_i = -1;
    local_48.y2.m_i = -1;
LAB_0065bf26:
    complete((QCompleter *)_o,rect);
    break;
  case 7:
    if (*(char *)(*(long *)(_o + 8) + 0xcc) != *_a[1]) {
      *(char *)(*(long *)(_o + 8) + 0xcc) = *_a[1];
    }
    break;
  case 8:
    QCompleterPrivate::_q_complete(*(QCompleterPrivate **)(_o + 8),*(QModelIndex *)_a[1],false);
    break;
  case 9:
    QCompleterPrivate::_q_completionSelected
              (*(QCompleterPrivate **)(_o + 8),(QItemSelection *)_a[1]);
    break;
  case 10:
    QCompleterPrivate::_q_autoResizePopup(*(QCompleterPrivate **)(_o + 8));
    break;
  case 0xb:
    QCompleterPrivate::_q_fileSystemModelDirectoryLoaded
              (*(QCompleterPrivate **)(_o + 8),(QString *)_a[1]);
  }
  if (_c != ReadProperty) {
    if (_c != WriteProperty) {
      if (_c != IndexOfMethod) goto switchD_0065bdde_caseD_3;
      plVar2 = (long *)_a[1];
      if (((code *)*plVar2 == activated) && (plVar2[1] == 0)) {
        *(undefined4 *)*_a = 0;
        goto switchD_0065bdde_caseD_3;
      }
      if (((code *)*plVar2 == activated) && (plVar2[1] == 0)) {
        *(undefined4 *)*_a = 1;
        goto switchD_0065bdde_caseD_3;
      }
      if (((code *)*plVar2 == highlighted) && (plVar2[1] == 0)) {
        *(undefined4 *)*_a = 2;
        goto switchD_0065bdde_caseD_3;
      }
      if (((code *)*plVar2 == highlighted) && (plVar2[1] == 0)) {
        *(undefined4 *)*_a = 3;
        goto switchD_0065bdde_caseD_3;
      }
      if (_c != WriteProperty) {
        if (_c != ReadProperty) goto switchD_0065bdde_caseD_3;
        goto switchD_0065bdde_caseD_1;
      }
    }
    goto switchD_0065bdde_caseD_2;
  }
switchD_0065bdde_caseD_1:
  if (8 < (uint)_id) goto LAB_0065c0d1;
  puVar3 = (undefined8 *)*_a;
  switch(_id) {
  case 0:
    lVar4 = *(long *)(_o + 8);
    piVar5 = *(int **)(lVar4 + 0xa0);
    uVar6 = *(undefined8 *)(lVar4 + 0xa8);
    uVar7 = *(undefined8 *)(lVar4 + 0xb0);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + 1;
      UNLOCK();
    }
    pQVar8 = (QArrayData *)*puVar3;
    *puVar3 = piVar5;
    puVar3[1] = uVar6;
    puVar3[2] = uVar7;
    if (pQVar8 != (QArrayData *)0x0) {
      LOCK();
      (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar8,2,0x10);
      }
    }
    goto LAB_0065c0d1;
  case 1:
    uVar9 = *(undefined4 *)(*(long *)(_o + 8) + 200);
    break;
  case 2:
    uVar9 = *(undefined4 *)(*(long *)(_o + 8) + 0x9c);
    break;
  case 3:
    uVar9 = *(undefined4 *)(*(long *)(_o + 8) + 0x98);
    break;
  case 4:
    uVar9 = *(undefined4 *)(*(long *)(_o + 8) + 0xc0);
    break;
  case 5:
    uVar9 = *(undefined4 *)(*(long *)(_o + 8) + 0xbc);
    break;
  case 6:
    uVar9 = *(undefined4 *)(*(long *)(_o + 8) + 0xc4);
    break;
  case 7:
    uVar9 = *(undefined4 *)(*(long *)(_o + 8) + 0xb8);
    break;
  case 8:
    *(undefined1 *)puVar3 = *(undefined1 *)(*(long *)(_o + 8) + 0xcc);
    goto LAB_0065c0d1;
  }
  *(undefined4 *)puVar3 = uVar9;
LAB_0065c0d1:
  if (_c == WriteProperty) {
switchD_0065bdde_caseD_2:
    if ((uint)_id < 9) {
      prefix = (QString *)*_a;
      switch(_id) {
      case 0:
        setCompletionPrefix((QCompleter *)_o,prefix);
        break;
      case 1:
        setModelSorting((QCompleter *)_o,*(ModelSorting *)&(prefix->d).d);
        break;
      case 2:
        setFilterMode((QCompleter *)_o,
                      (QFlagsStorageHelper<Qt::MatchFlag,_4>)
                      *(QFlagsStorageHelper<Qt::MatchFlag,_4> *)&(prefix->d).d);
        break;
      case 3:
        setCompletionMode((QCompleter *)_o,*(CompletionMode *)&(prefix->d).d);
        break;
      case 4:
        setCompletionColumn((QCompleter *)_o,*(int *)&(prefix->d).d);
        break;
      case 5:
        setCompletionRole((QCompleter *)_o,*(int *)&(prefix->d).d);
        break;
      case 6:
        iVar10 = *(int *)&(prefix->d).d;
        if (iVar10 < 0) {
          local_48.x1.m_i = 2;
          local_48.y1.m_i = 0;
          local_48.x2.m_i = 0;
          local_48.y2.m_i = 0;
          uStack_38 = 0;
          local_34 = 0;
          local_30 = "default";
          QMessageLogger::warning
                    ((char *)&local_48,
                     "QCompleter::setMaxVisibleItems: Invalid max visible items (%d) must be >= 0");
        }
        else {
          *(int *)(*(long *)(_o + 8) + 0xc4) = iVar10;
        }
        break;
      case 7:
        setCaseSensitivity((QCompleter *)_o,*(CaseSensitivity *)&(prefix->d).d);
        break;
      case 8:
        cVar1 = *(char *)&(prefix->d).d;
        if (*(char *)(*(long *)(_o + 8) + 0xcc) != cVar1) {
          *(char *)(*(long *)(_o + 8) + 0xcc) = cVar1;
        }
      }
    }
  }
switchD_0065bdde_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCompleter::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QCompleter *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->activated((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->activated((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 2: _t->highlighted((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 3: _t->highlighted((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 4: _t->setCompletionPrefix((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 5: _t->complete((*reinterpret_cast< std::add_pointer_t<QRect>>(_a[1]))); break;
        case 6: _t->complete(); break;
        case 7: _t->setWrapAround((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 8: _t->d_func()->_q_complete((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 9: _t->d_func()->_q_completionSelected((*reinterpret_cast< std::add_pointer_t<QItemSelection>>(_a[1]))); break;
        case 10: _t->d_func()->_q_autoResizePopup(); break;
        case 11: _t->d_func()->_q_fileSystemModelDirectoryLoaded((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QCompleter::*)(const QString & )>(_a, &QCompleter::activated, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCompleter::*)(const QModelIndex & )>(_a, &QCompleter::activated, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCompleter::*)(const QString & )>(_a, &QCompleter::highlighted, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCompleter::*)(const QModelIndex & )>(_a, &QCompleter::highlighted, 3))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->completionPrefix(); break;
        case 1: *reinterpret_cast<ModelSorting*>(_v) = _t->modelSorting(); break;
        case 2: *reinterpret_cast<Qt::MatchFlags*>(_v) = _t->filterMode(); break;
        case 3: *reinterpret_cast<CompletionMode*>(_v) = _t->completionMode(); break;
        case 4: *reinterpret_cast<int*>(_v) = _t->completionColumn(); break;
        case 5: *reinterpret_cast<int*>(_v) = _t->completionRole(); break;
        case 6: *reinterpret_cast<int*>(_v) = _t->maxVisibleItems(); break;
        case 7: *reinterpret_cast<Qt::CaseSensitivity*>(_v) = _t->caseSensitivity(); break;
        case 8: *reinterpret_cast<bool*>(_v) = _t->wrapAround(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setCompletionPrefix(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setModelSorting(*reinterpret_cast<ModelSorting*>(_v)); break;
        case 2: _t->setFilterMode(*reinterpret_cast<Qt::MatchFlags*>(_v)); break;
        case 3: _t->setCompletionMode(*reinterpret_cast<CompletionMode*>(_v)); break;
        case 4: _t->setCompletionColumn(*reinterpret_cast<int*>(_v)); break;
        case 5: _t->setCompletionRole(*reinterpret_cast<int*>(_v)); break;
        case 6: _t->setMaxVisibleItems(*reinterpret_cast<int*>(_v)); break;
        case 7: _t->setCaseSensitivity(*reinterpret_cast<Qt::CaseSensitivity*>(_v)); break;
        case 8: _t->setWrapAround(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}